

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.h
# Opt level: O1

void m2v_set_el(m2v *M,int r,int c,int val)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = c + 0x1f;
  if (-1 < c) {
    iVar1 = c;
  }
  iVar1 = (iVar1 >> 5) + r * M->row_stride;
  uVar2 = 1 << ((byte)c & 0x1f);
  if (val != 0) {
    M->e[iVar1] = M->e[iVar1] | uVar2;
    return;
  }
  M->e[iVar1] = M->e[iVar1] & ~uVar2;
  return;
}

Assistant:

inline void m2v_set_el(m2v* M, int r, int c, int val)
{
	assert(0 <= r && r < M->n_row);
	assert(0 <= c && c < M->n_col);
	const int w = m2v__get_word(M, r, c);
	const int b = m2v__get_bit(M, c);
	const m2v_base m = m2v__get_mask(b);
	if (val) {
		M->e[w] |= m;
	} else {
		M->e[w] &= ~m;
	}
}